

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::NetworkUpdateParameters::InternalSwap
          (NetworkUpdateParameters *this,NetworkUpdateParameters *other)

{
  NetworkUpdateParameters *other_local;
  NetworkUpdateParameters *this_local;
  
  google::protobuf::internal::InternalMetadata::InternalSwap
            (&(this->super_MessageLite)._internal_metadata_,
             &(other->super_MessageLite)._internal_metadata_);
  google::protobuf::RepeatedPtrField<CoreML::Specification::LossLayer>::InternalSwap
            (&this->losslayers_,&other->losslayers_);
  google::protobuf::internal::memswap<32>((char *)&this->optimizer_,(char *)&other->optimizer_);
  return;
}

Assistant:

void NetworkUpdateParameters::InternalSwap(NetworkUpdateParameters* other) {
  using std::swap;
  _internal_metadata_.InternalSwap(&other->_internal_metadata_);
  losslayers_.InternalSwap(&other->losslayers_);
  ::PROTOBUF_NAMESPACE_ID::internal::memswap<
      PROTOBUF_FIELD_OFFSET(NetworkUpdateParameters, seed_)
      + sizeof(NetworkUpdateParameters::seed_)
      - PROTOBUF_FIELD_OFFSET(NetworkUpdateParameters, optimizer_)>(
          reinterpret_cast<char*>(&optimizer_),
          reinterpret_cast<char*>(&other->optimizer_));
}